

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umsg.cpp
# Opt level: O0

UMessageFormat *
umsg_open_63(UChar *pattern,int32_t patternLength,char *locale,UParseError *parseError,
            UErrorCode *status)

{
  UBool UVar1;
  MessageFormat *this;
  size_t size;
  MessageFormat *local_200;
  int32_t local_1e4;
  Locale local_1d8;
  undefined1 local_f1;
  MessageFormat *local_f0;
  MessageFormat *local_e8;
  MessageFormat *retVal;
  ConstChar16Ptr local_d0;
  undefined1 local_c8 [8];
  UnicodeString patString;
  UErrorCode local_80;
  int32_t len;
  UParseError tErr;
  UErrorCode *status_local;
  UParseError *parseError_local;
  char *locale_local;
  int32_t patternLength_local;
  UChar *pattern_local;
  
  if ((status == (UErrorCode *)0x0) ||
     (tErr.postContext._24_8_ = status, UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    pattern_local = (UChar *)0x0;
  }
  else if ((pattern == (UChar *)0x0) || (patternLength < -1)) {
    *(undefined4 *)tErr.postContext._24_8_ = 1;
    pattern_local = (UChar *)0x0;
  }
  else {
    status_local = &parseError->line;
    if (parseError == (UParseError *)0x0) {
      status_local = &local_80;
    }
    local_1e4 = patternLength;
    if (patternLength == -1) {
      local_1e4 = u_strlen_63(pattern);
    }
    patString.fUnion._52_4_ = local_1e4;
    icu_63::ConstChar16Ptr::ConstChar16Ptr(&local_d0,pattern);
    size = (size_t)(patternLength == -1);
    icu_63::UnicodeString::UnicodeString
              ((UnicodeString *)local_c8,patternLength == -1,&local_d0,patString.fUnion._52_4_);
    icu_63::ConstChar16Ptr::~ConstChar16Ptr(&local_d0);
    this = (MessageFormat *)icu_63::UMemory::operator_new((UMemory *)0x330,size);
    local_200 = (MessageFormat *)0x0;
    if (this != (MessageFormat *)0x0) {
      local_f1 = 1;
      local_f0 = this;
      icu_63::Locale::Locale(&local_1d8,locale,(char *)0x0,(char *)0x0,(char *)0x0);
      icu_63::MessageFormat::MessageFormat
                (this,(UnicodeString *)local_c8,&local_1d8,(UParseError *)status_local,
                 (UErrorCode *)tErr.postContext._24_8_);
      local_200 = this;
    }
    local_f1 = 0;
    if (this != (MessageFormat *)0x0) {
      icu_63::Locale::~Locale(&local_1d8);
    }
    local_e8 = local_200;
    if (local_200 == (MessageFormat *)0x0) {
      *(undefined4 *)tErr.postContext._24_8_ = 7;
      pattern_local = (UChar *)0x0;
    }
    else {
      UVar1 = U_SUCCESS(*(UErrorCode *)tErr.postContext._24_8_);
      if ((UVar1 != '\0') &&
         (UVar1 = icu_63::MessageFormatAdapter::hasArgTypeConflicts(local_e8), UVar1 != '\0')) {
        *(undefined4 *)tErr.postContext._24_8_ = 0x1010c;
      }
      pattern_local = (UChar *)local_e8;
    }
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_c8);
  }
  return (UMessageFormat *)pattern_local;
}

Assistant:

U_CAPI UMessageFormat* U_EXPORT2
umsg_open(  const UChar     *pattern,
            int32_t         patternLength,
            const  char     *locale,
            UParseError     *parseError,
            UErrorCode      *status)
{
    //check arguments
    if(status==NULL || U_FAILURE(*status))
    {
      return 0;
    }
    if(pattern==NULL||patternLength<-1){
        *status=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    UParseError tErr;
    if(parseError==NULL)
    {
        parseError = &tErr;
    }

    int32_t len = (patternLength == -1 ? u_strlen(pattern) : patternLength);
    UnicodeString patString(patternLength == -1, pattern, len);

    MessageFormat* retVal = new MessageFormat(patString,Locale(locale),*parseError,*status);
    if(retVal == NULL) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    if (U_SUCCESS(*status) && MessageFormatAdapter::hasArgTypeConflicts(*retVal)) {
        *status = U_ARGUMENT_TYPE_MISMATCH;
    }
    return (UMessageFormat*)retVal;
}